

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O1

void ipc_ep_accept(void *arg,nni_aio *aio)

{
  _Bool _Var1;
  nng_err result;
  
  nni_aio_reset(aio);
  nni_mtx_lock((nni_mtx *)arg);
  if (*(char *)((long)arg + 0x33) == '\x01') {
    result = NNG_ECLOSED;
  }
  else {
    if (*(long *)((long)arg + 0x58) == 0) {
      _Var1 = nni_aio_start(aio,ipc_ep_cancel,arg);
      if (_Var1) {
        *(nni_aio **)((long)arg + 0x58) = aio;
        if (*(char *)((long)arg + 0x32) == '\0') {
          *(undefined1 *)((long)arg + 0x32) = 1;
          nng_stream_listener_accept
                    (*(nng_stream_listener **)((long)arg + 0x40),(nng_aio *)((long)arg + 0x60));
        }
        else {
          ipc_ep_match((ipc_ep *)arg);
        }
      }
      goto LAB_0011f90b;
    }
    result = NNG_EBUSY;
  }
  nni_aio_finish_error(aio,result);
LAB_0011f90b:
  nni_mtx_unlock((nni_mtx *)arg);
  return;
}

Assistant:

static void
ipc_ep_accept(void *arg, nni_aio *aio)
{
	ipc_ep *ep = arg;

	nni_aio_reset(aio);
	nni_mtx_lock(&ep->mtx);
	if (ep->closed) {
		nni_aio_finish_error(aio, NNG_ECLOSED);
		nni_mtx_unlock(&ep->mtx);
		return;
	}
	if (ep->user_aio != NULL) {
		nni_aio_finish_error(aio, NNG_EBUSY);
		nni_mtx_unlock(&ep->mtx);
		return;
	}
	if (!nni_aio_start(aio, ipc_ep_cancel, ep)) {
		nni_mtx_unlock(&ep->mtx);
		return;
	}
	ep->user_aio = aio;
	if (!ep->started) {
		ep->started = true;
		nng_stream_listener_accept(ep->listener, &ep->conn_aio);
	} else {
		ipc_ep_match(ep);
	}

	nni_mtx_unlock(&ep->mtx);
}